

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_struct.cpp
# Opt level: O3

BoundCastInfo *
duckdb::StructToUnionCast::Bind
          (BoundCastInfo *__return_storage_ptr__,BindCastInput *input,LogicalType *source,
          LogicalType *target)

{
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_20;
  BoundCastData *local_18;
  
  BindData((StructToUnionCast *)&local_18,input,source,target);
  local_20._M_head_impl = local_18;
  BoundCastInfo::BoundCastInfo
            (__return_storage_ptr__,Cast,
             (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true> *)
             &local_20,StructBoundCastData::InitStructCastLocalState);
  if (local_20._M_head_impl != (BoundCastData *)0x0) {
    (*(local_20._M_head_impl)->_vptr_BoundCastData[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

BoundCastInfo StructToUnionCast::Bind(BindCastInput &input, const LogicalType &source, const LogicalType &target) {
	auto cast_data = StructToUnionCast::BindData(input, source, target);
	return BoundCastInfo(&StructToUnionCast::Cast, std::move(cast_data), StructBoundCastData::InitStructCastLocalState);
}